

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQbf.c
# Opt level: O3

void Abc_NtkQbf(Abc_Ntk_t *pNtk,int nPars,int nItersMax,int fDumpCnf,int fVerbose)

{
  uint *puVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p;
  void *__s;
  time_t tVar5;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar6;
  Abc_Ntk_t *pNtk_01;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Int_t *vExists;
  int *piVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  Vec_Int_t *p_00;
  int iVar15;
  timespec ts;
  long local_58;
  long local_38;
  
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQbf.c"
                  ,0x47,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->nObjCounts[8] != 0) {
    __assert_fail("Abc_NtkIsComb(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQbf.c"
                  ,0x48,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQbf.c"
                  ,0x49,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  if (nPars < 1) {
LAB_002f5d26:
    __assert_fail("nPars > 0 && nPars < Abc_NtkPiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcQbf.c"
                  ,0x4a,"void Abc_NtkQbf(Abc_Ntk_t *, int, int, int, int)");
  }
  uVar4 = pNtk->vPis->nSize;
  if ((int)uVar4 <= nPars) goto LAB_002f5d26;
  if (fDumpCnf != 0) {
    __s = (void *)0x0;
    pAig = Abc_NtkToDar(pNtk,0,0);
    p = Cnf_Derive(pAig,0);
    iVar3 = p->nVars;
    iVar15 = 0x10;
    if (0xe < iVar3 - 1U) {
      iVar15 = iVar3;
    }
    if (iVar15 != 0) {
      __s = malloc((long)iVar15 << 2);
      if (__s == (void *)0x0) {
        __s = (void *)0x0;
      }
      else {
        memset(__s,0,(long)iVar3 * 4);
      }
    }
    pVVar2 = pAig->vCis;
    iVar15 = pVVar2->nSize;
    if (0 < iVar15) {
      uVar13 = 0;
      do {
        if (uVar13 < (uint)nPars) {
          iVar15 = p->pVarNums[*(int *)((long)pVVar2->pArray[uVar13] + 0x24)];
          if (((long)iVar15 < 0) || (iVar3 <= iVar15)) goto LAB_002f5ce8;
          *(undefined4 *)((long)__s + (long)iVar15 * 4) = 1;
          iVar15 = pVVar2->nSize;
        }
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)iVar15);
    }
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    uVar13 = 0x10;
    if (0x10 < (uint)nPars) {
      uVar13 = (ulong)(uint)nPars;
    }
    piVar9 = (int *)0x0;
    pVVar7->nSize = 0;
    pVVar7->nCap = (int)uVar13;
    piVar8 = (int *)malloc(uVar13 << 2);
    pVVar7->pArray = piVar8;
    iVar15 = pNtk->vPis->nSize - nPars;
    vExists = (Vec_Int_t *)malloc(0x10);
    if (iVar15 - 1U < 0xf) {
      iVar15 = 0x10;
    }
    vExists->nSize = 0;
    vExists->nCap = iVar15;
    if (iVar15 != 0) {
      piVar9 = (int *)malloc((long)iVar15 << 2);
    }
    vExists->pArray = piVar9;
    if (0 < iVar3) {
      lVar11 = 0;
      do {
        p_00 = vExists;
        if (*(int *)((long)__s + lVar11 * 4) != 0) {
          p_00 = pVVar7;
        }
        Vec_IntPush(p_00,(int)lVar11);
        lVar11 = lVar11 + 1;
      } while (iVar3 != lVar11);
    }
    pcVar10 = Extra_FileNameGenericAppend(pNtk->pSpec,".qdimacs");
    Cnf_DataWriteIntoFile(p,pcVar10,0,pVVar7,vExists);
    Aig_ManStop(pAig);
    Cnf_DataFree(p);
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
    }
    free(pVVar7);
    if (vExists->pArray != (int *)0x0) {
      free(vExists->pArray);
    }
    free(vExists);
    if (__s != (void *)0x0) {
      free(__s);
    }
    printf("The 2QBF formula was written into file \"%s\".\n",pcVar10);
    return;
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar13 = 0x10;
  if (0xe < uVar4 - 1) {
    uVar13 = (ulong)uVar4;
  }
  pVVar7->nCap = (int)uVar13;
  piVar8 = (int *)malloc(uVar13 << 2);
  pVVar7->pArray = piVar8;
  pVVar7->nSize = uVar4;
  if (piVar8 != (int *)0x0) {
    memset(piVar8,0,(ulong)uVar4 << 2);
  }
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  if (nPars < pNtk->vPis->nSize) {
    uVar13 = (ulong)(uint)nPars;
    do {
      uVar4 = rand();
      if (pVVar7->nSize <= (int)uVar13) {
LAB_002f5ce8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pVVar7->pArray[uVar13] = uVar4 & 1;
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < pNtk->vPis->nSize);
  }
  Abc_NtkVectorClearPars(pVVar7,nPars);
  pNtk_00 = Abc_NtkMiterCofactor(pNtk,pVVar7);
  if (fVerbose != 0) {
    printf("Iter %2d : ",0);
    printf("AIG = %6d  ",(ulong)(uint)pNtk_00->nObjCounts[7]);
    Abc_NtkVectorPrintVars(pNtk,pVVar7,nPars);
    putchar(10);
  }
  if (nItersMax < 1) {
    uVar4 = 0;
LAB_002f5bae:
    Abc_NtkDelete(pNtk_00);
    if (uVar4 != nItersMax) {
      iVar3 = 0x99eebc;
      printf("Implementation does not exist.  ");
      goto LAB_002f5bda;
    }
  }
  else {
    uVar4 = 0;
    do {
      iVar3 = clock_gettime(3,(timespec *)&ts);
      if (iVar3 < 0) {
        local_58 = 1;
      }
      else {
        lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
        local_58 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
      }
      iVar3 = Abc_NtkDSat(pNtk_00,0,0,0,0,0,1,0,0,0);
      iVar15 = clock_gettime(3,(timespec *)&ts);
      if (iVar15 < 0) {
        local_38 = -1;
      }
      else {
        local_38 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      if (iVar3 != 0) {
        if (iVar3 == -1) {
          pcVar10 = "Synthesis timed out.";
LAB_002f5ba5:
          puts(pcVar10);
        }
        else if (iVar3 != 1) goto LAB_002f581b;
        goto LAB_002f5bae;
      }
      Abc_NtkModelToVector(pNtk_00,pVVar7);
LAB_002f581b:
      pVVar2 = pNtk->vPis;
      uVar13 = (ulong)(uint)nPars;
      if (nPars < pVVar2->nSize) {
        do {
          if (pVVar7->nSize <= (int)uVar13) goto LAB_002f5ce8;
          pVVar7->pArray[uVar13] = -1;
          uVar13 = uVar13 + 1;
        } while ((int)uVar13 < pVVar2->nSize);
      }
      pAVar6 = Abc_NtkMiterCofactor(pNtk,pVVar7);
      if (pAVar6->vPos->nSize < 1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (uint *)((long)*pAVar6->vPos->pArray + 0x14);
      *puVar1 = *puVar1 ^ 0x400;
      clock_gettime(3,(timespec *)&ts);
      iVar3 = Abc_NtkMiterSat(pAVar6,0,0,0,(ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
      clock_gettime(3,(timespec *)&ts);
      if (iVar3 != 0) {
        Abc_NtkDelete(pAVar6);
        if (iVar3 == -1) {
          pcVar10 = "Verification timed out.";
          goto LAB_002f5ba5;
        }
        if (iVar3 != 1) goto LAB_002f58d5;
        Abc_NtkDelete(pNtk_00);
        if ((long)pVVar7->nSize < 1) {
          uVar14 = 0;
        }
        else {
          lVar12 = 0;
          uVar14 = 0;
          do {
            uVar14 = uVar14 + (pVVar7->pArray[lVar12] == 0);
            lVar12 = lVar12 + 1;
          } while (pVVar7->nSize != lVar12);
        }
        printf("Parameters: ");
        uVar13 = 0;
        do {
          if ((long)pVVar7->nSize <= (long)uVar13) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          printf("%d",(ulong)(uint)pVVar7->pArray[uVar13]);
          uVar13 = uVar13 + 1;
        } while ((uint)nPars != uVar13);
        printf("  Statistics: 0=%d 1=%d\n",(ulong)uVar14,(ulong)(pVVar7->nSize - uVar14));
        pcVar10 = "Solved after %d iterations.  ";
        goto LAB_002f5bc3;
      }
      Abc_NtkModelToVector(pAVar6,pVVar7);
      Abc_NtkDelete(pAVar6);
LAB_002f58d5:
      Abc_NtkVectorClearPars(pVVar7,nPars);
      pAVar6 = Abc_NtkMiterCofactor(pNtk,pVVar7);
      pNtk_01 = Abc_NtkMiterAnd(pNtk_00,pAVar6,0,0);
      Abc_NtkDelete(pAVar6);
      Abc_NtkDelete(pNtk_00);
      uVar4 = uVar4 + 1;
      if (fVerbose != 0) {
        printf("Iter %2d : ",(ulong)uVar4);
        printf("AIG = %6d  ",(ulong)(uint)pNtk_01->nObjCounts[7]);
        Abc_NtkVectorPrintVars(pNtk,pVVar7,nPars);
        iVar3 = 0x9b526b;
        printf("  ");
        Abc_Print(iVar3,"%s =","Syn");
        Abc_Print(iVar3,"%9.2f sec\n",(double)(local_38 + local_58) / 1000000.0);
      }
      pNtk_00 = pNtk_01;
    } while (uVar4 != nItersMax);
    Abc_NtkDelete(pNtk_01);
  }
  pcVar10 = "Quit after %d iterations.  ";
  uVar4 = nItersMax;
LAB_002f5bc3:
  printf(pcVar10,(ulong)uVar4);
  iVar3 = (int)pcVar10;
LAB_002f5bda:
  Abc_Print(iVar3,"%s =","Total runtime");
  iVar15 = 3;
  iVar3 = clock_gettime(3,(timespec *)&ts);
  if (iVar3 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar12 + lVar11) / 1000000.0);
  if (pVVar7->pArray != (int *)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  return;
}

Assistant:

void Abc_NtkQbf( Abc_Ntk_t * pNtk, int nPars, int nItersMax, int fDumpCnf, int fVerbose )
{
    Abc_Ntk_t * pNtkVer, * pNtkSyn, * pNtkSyn2, * pNtkTemp;
    Vec_Int_t * vPiValues;
    abctime clkTotal = Abc_Clock(), clkS, clkV;
    int nIters, nInputs, RetValue, fFound = 0;

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkIsComb(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( nPars > 0 && nPars < Abc_NtkPiNum(pNtk) );
//    assert( Abc_NtkPiNum(pNtk)-nPars < 32 );
    nInputs = Abc_NtkPiNum(pNtk) - nPars;

    if ( fDumpCnf )
    {
        // original problem: \exists p \forall x \exists y.  M(p,x,y)
        // negated problem:  \forall p \exists x \exists y. !M(p,x,y)
        extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
        Aig_Man_t * pMan = Abc_NtkToDar( pNtk, 0, 0 );
        Cnf_Dat_t * pCnf = Cnf_Derive( pMan, 0 );
        Vec_Int_t * vVarMap, * vForAlls, * vExists;
        Aig_Obj_t * pObj;
        char * pFileName;
        int i, Entry;
        // create var map
        vVarMap = Vec_IntStart( pCnf->nVars );
        Aig_ManForEachCi( pMan, pObj, i )
            if ( i < nPars )
                Vec_IntWriteEntry( vVarMap, pCnf->pVarNums[Aig_ObjId(pObj)], 1 );
        // create various maps
        vForAlls = Vec_IntAlloc( nPars );
        vExists = Vec_IntAlloc( Abc_NtkPiNum(pNtk) - nPars );
        Vec_IntForEachEntry( vVarMap, Entry, i )
            if ( Entry )
                Vec_IntPush( vForAlls, i );
            else
                Vec_IntPush( vExists, i );
        // generate CNF
        pFileName = Extra_FileNameGenericAppend( pNtk->pSpec, ".qdimacs" );
        Cnf_DataWriteIntoFile( pCnf, pFileName, 0, vForAlls, vExists );
        Aig_ManStop( pMan );
        Cnf_DataFree( pCnf );
        Vec_IntFree( vForAlls );
        Vec_IntFree( vExists );
        Vec_IntFree( vVarMap );
        printf( "The 2QBF formula was written into file \"%s\".\n", pFileName );
        return;
    }

    // initialize the synthesized network with 0000-combination
    vPiValues = Vec_IntStart( Abc_NtkPiNum(pNtk) );

    // create random init value
    {
    int i;
    srand( time(NULL) );
    for ( i = nPars; i < Abc_NtkPiNum(pNtk); i++ )
        Vec_IntWriteEntry( vPiValues, i, rand() & 1 );
    }

    Abc_NtkVectorClearPars( vPiValues, nPars );
    pNtkSyn = Abc_NtkMiterCofactor( pNtk, vPiValues );
    if ( fVerbose )
    {
        printf( "Iter %2d : ", 0 );
        printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
        Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
        printf( "\n" );
    }

    // iteratively solve
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        // solve the synthesis instance
clkS = Abc_Clock();
//        RetValue = Abc_NtkMiterSat( pNtkSyn, 0, 0, 0, NULL, NULL );
        RetValue = Abc_NtkDSat( pNtkSyn, (ABC_INT64_T)0, (ABC_INT64_T)0, 0, 0, 0, 1, 0, 0, 0 );
clkS = Abc_Clock() - clkS;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkSyn, vPiValues );
        if ( RetValue == 1 )
        {
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Synthesis timed out.\n" );
            break;
        }
        // there is a counter-example

        // construct the verification instance
        Abc_NtkVectorClearVars( pNtk, vPiValues, nPars );
        pNtkVer = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // complement the output
        Abc_ObjXorFaninC( Abc_NtkPo(pNtkVer,0), 0 );

        // solve the verification instance
clkV = Abc_Clock();
        RetValue = Abc_NtkMiterSat( pNtkVer, 0, 0, 0, NULL, NULL );
clkV = Abc_Clock() - clkV;
        if ( RetValue == 0 )
            Abc_NtkModelToVector( pNtkVer, vPiValues );
        Abc_NtkDelete( pNtkVer );
        if ( RetValue == 1 )
        {
            fFound = 1;
            break;
        }
        if ( RetValue == -1 )
        {
            printf( "Verification timed out.\n" );
            break;
        }
        // there is a counter-example

        // create a new synthesis network
        Abc_NtkVectorClearPars( vPiValues, nPars );
        pNtkSyn2 = Abc_NtkMiterCofactor( pNtk, vPiValues );
        // add to the synthesis instance
        pNtkSyn = Abc_NtkMiterAnd( pNtkTemp = pNtkSyn, pNtkSyn2, 0, 0 );
        Abc_NtkDelete( pNtkSyn2 );
        Abc_NtkDelete( pNtkTemp );

        if ( fVerbose )
        {
            printf( "Iter %2d : ", nIters+1 );
            printf( "AIG = %6d  ", Abc_NtkNodeNum(pNtkSyn) );
            Abc_NtkVectorPrintVars( pNtk, vPiValues, nPars );
            printf( "  " );
            ABC_PRT( "Syn", clkS );
//            ABC_PRT( "Ver", clkV );
        }
    }
    Abc_NtkDelete( pNtkSyn );
    // report the results
    if ( fFound )
    {
        int nZeros = Vec_IntCountZero( vPiValues );
        printf( "Parameters: " );
        Abc_NtkVectorPrintPars( vPiValues, nPars );
        printf( "  Statistics: 0=%d 1=%d\n", nZeros, Vec_IntSize(vPiValues) - nZeros );
        printf( "Solved after %d iterations.  ", nIters );
    }
    else if ( nIters == nItersMax )
        printf( "Quit after %d iterations.  ", nItersMax );
    else
        printf( "Implementation does not exist.  " );
    ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );
    Vec_IntFree( vPiValues );
}